

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncat.c
# Opt level: O1

int main(void)

{
  size_t sVar1;
  char s [10];
  undefined8 local_18;
  undefined2 local_10;
  
  local_18 = 0x7878787878007878;
  local_10 = 0x78;
  sVar1 = strlen((char *)&local_18);
  *(undefined4 *)((long)&local_18 + sVar1) = 0x64636261;
  *(undefined2 *)((long)&local_18 + sVar1 + 4) = 0x65;
  if (local_18._2_1_ != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x2b,"s[2] == \'a\'");
  }
  if (local_18._6_1_ != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x2c,"s[6] == \'e\'");
  }
  if (local_18._7_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x2d,"s[7] == \'\\0\'");
  }
  if ((char)local_10 != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x2e,"s[8] == \'x\'");
  }
  local_18 = local_18 & 0xffffffffffffff00;
  sVar1 = strlen((char *)&local_18);
  *(undefined4 *)((long)&local_18 + sVar1) = 0x64636261;
  *(undefined2 *)((long)&local_18 + sVar1 + 4) = 0x78;
  if (local_18._4_1_ != 'x') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x31,"s[4] == \'x\'");
  }
  if (local_18._5_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x32,"s[5] == \'\\0\'");
  }
  if (local_18._5_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x34,"s[5] == \'\\0\'");
  }
  if (local_18._6_1_ != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x35,"s[6] == \'e\'");
  }
  if (local_18._5_1_ != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x37,"s[5] == \'\\0\'");
  }
  if (local_18._6_1_ != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x38,"s[6] == \'e\'");
  }
  strncat((char *)&local_18,"abcde",3);
  if (local_18._5_1_ != 'a') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x3a,"s[5] == \'a\'");
  }
  if (local_18._7_1_ != 'c') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x3b,"s[7] == \'c\'");
  }
  if ((char)local_10 != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strncat.c, line %d - %s\n"
           ,0x3c,"s[8] == \'\\0\'");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char s[] = "xx\0xxxxxx";
    TESTCASE( strncat( s, abcde, 10 ) == s );
    TESTCASE( s[2] == 'a' );
    TESTCASE( s[6] == 'e' );
    TESTCASE( s[7] == '\0' );
    TESTCASE( s[8] == 'x' );
    s[0] = '\0';
    TESTCASE( strncat( s, abcdx, 10 ) == s );
    TESTCASE( s[4] == 'x' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( strncat( s, "\0", 10 ) == s );
    TESTCASE( s[5] == '\0' );
    TESTCASE( s[6] == 'e' );
    TESTCASE( strncat( s, abcde, 0 ) == s );
    TESTCASE( s[5] == '\0' );
    TESTCASE( s[6] == 'e' );
    TESTCASE( strncat( s, abcde, 3 ) == s );
    TESTCASE( s[5] == 'a' );
    TESTCASE( s[7] == 'c' );
    TESTCASE( s[8] == '\0' );
    return TEST_RESULTS;
}